

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O0

ostream * glu::detail::operator<<(ostream *str,TextureParameterValueStr *valueStr)

{
  deUint32 dVar1;
  Hex<8UL> hex;
  Enum<int,_2UL> EVar2;
  Enum<int,_2UL> local_d0;
  GetNameFunc local_c0;
  int local_b8;
  Enum<int,_2UL> local_b0;
  GetNameFunc local_a0;
  int local_98;
  Enum<int,_2UL> local_90;
  GetNameFunc local_80;
  int local_78;
  Enum<int,_2UL> local_70;
  GetNameFunc local_60;
  int local_58;
  Enum<int,_2UL> local_50;
  GetNameFunc local_40;
  int local_38;
  Enum<int,_2UL> local_30;
  TextureParameterValueStr *local_20;
  TextureParameterValueStr *valueStr_local;
  ostream *str_local;
  
  dVar1 = valueStr->param;
  local_20 = valueStr;
  valueStr_local = (TextureParameterValueStr *)str;
  if (dVar1 - 0x2800 < 2) {
    EVar2 = getTextureFilterStr(valueStr->value);
    local_c0 = EVar2.m_getName;
    local_b8 = EVar2.m_value;
    local_b0.m_getName = local_c0;
    local_b0.m_value = local_b8;
    str_local = tcu::Format::operator<<(str,&local_b0);
  }
  else if ((dVar1 - 0x2802 < 2) || (dVar1 == 0x8072)) {
    EVar2 = getTextureWrapModeStr(valueStr->value);
    local_40 = EVar2.m_getName;
    local_38 = EVar2.m_value;
    local_30.m_getName = local_40;
    local_30.m_value = local_38;
    str_local = tcu::Format::operator<<(str,&local_30);
  }
  else if (dVar1 - 0x813a < 4) {
    str_local = (ostream *)std::ostream::operator<<(str,valueStr->value);
  }
  else if (dVar1 == 0x884c) {
    EVar2 = getTextureCompareModeStr(valueStr->value);
    local_60 = EVar2.m_getName;
    local_58 = EVar2.m_value;
    local_50.m_getName = local_60;
    local_50.m_value = local_58;
    str_local = tcu::Format::operator<<(str,&local_50);
  }
  else if (dVar1 == 0x884d) {
    EVar2 = getCompareFuncStr(valueStr->value);
    local_80 = EVar2.m_getName;
    local_78 = EVar2.m_value;
    local_70.m_getName = local_80;
    local_70.m_value = local_78;
    str_local = tcu::Format::operator<<(str,&local_70);
  }
  else if (dVar1 - 0x8e42 < 4) {
    EVar2 = getTextureSwizzleStr(valueStr->value);
    local_a0 = EVar2.m_getName;
    local_98 = EVar2.m_value;
    local_90.m_getName = local_a0;
    local_90.m_value = local_98;
    str_local = tcu::Format::operator<<(str,&local_90);
  }
  else if (dVar1 == 0x90ea) {
    EVar2 = getTextureDepthStencilModeStr(valueStr->value);
    local_d0.m_getName = EVar2.m_getName;
    local_d0.m_value = EVar2.m_value;
    str_local = tcu::Format::operator<<(str,&local_d0);
  }
  else {
    hex = tcu::toHex<int>(valueStr->value);
    str_local = tcu::Format::operator<<(str,hex);
  }
  return str_local;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const TextureParameterValueStr& valueStr)
{
	switch (valueStr.param)
	{
		case GL_TEXTURE_WRAP_S:
		case GL_TEXTURE_WRAP_T:
		case GL_TEXTURE_WRAP_R:
			return str << getTextureWrapModeStr(valueStr.value);

		case GL_TEXTURE_BASE_LEVEL:
		case GL_TEXTURE_MAX_LEVEL:
		case GL_TEXTURE_MAX_LOD:
		case GL_TEXTURE_MIN_LOD:
			return str << valueStr.value;

		case GL_TEXTURE_COMPARE_MODE:
			return str << getTextureCompareModeStr(valueStr.value);

		case GL_TEXTURE_COMPARE_FUNC:
			return str << getCompareFuncStr(valueStr.value);

		case GL_TEXTURE_SWIZZLE_R:
		case GL_TEXTURE_SWIZZLE_G:
		case GL_TEXTURE_SWIZZLE_B:
		case GL_TEXTURE_SWIZZLE_A:
			return str << getTextureSwizzleStr(valueStr.value);

		case GL_TEXTURE_MIN_FILTER:
		case GL_TEXTURE_MAG_FILTER:
			return str << getTextureFilterStr(valueStr.value);

		case GL_DEPTH_STENCIL_TEXTURE_MODE:
			return str << getTextureDepthStencilModeStr(valueStr.value);

		default:
			return str << tcu::toHex(valueStr.value);
	}
}